

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int condSect1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  
  iVar1 = 0;
  if (tok != 0xf) {
    if (tok == 0x19) {
      state->handler = externalSubset1;
      state->includeLevel = state->includeLevel + 1;
      return 0;
    }
    if ((tok != 0x1c) || (iVar1 = 0x34, state->documentEntity != 0)) {
      state->handler = error;
      return -1;
    }
  }
  return iVar1;
}

Assistant:

static
int condSect1(PROLOG_STATE *state,
              int tok,
              const char *ptr,
              const char *end,
              const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_OPEN_BRACKET:
    state->handler = externalSubset1;
    state->includeLevel += 1;
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}